

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableOffsetCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  TestCaseGroup *parentStructure_00;
  SharedPtr *pSVar1;
  TestCaseGroup *pTVar2;
  ArrayElement *this;
  allocator<char> local_99;
  string local_98;
  TestCaseGroup *local_78;
  TestCaseGroup *blockGroup_1;
  SharedPtr unsized;
  string local_58;
  TestCaseGroup *local_28;
  TestCaseGroup *blockGroup;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  blockGroup = targetGroup;
  targetGroup_local = (TestCaseGroup *)parentStructure;
  parentStructure_local = (SharedPtr *)context;
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(Context *)parentStructure_local,"sized","Sized target");
  local_28 = pTVar2;
  tcu::TestNode::addChild(&blockGroup->super_TestNode,(TestNode *)pTVar2);
  pSVar1 = parentStructure_local;
  parentStructure_00 = targetGroup_local;
  pTVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"",(allocator<char> *)((long)&unsized.m_state + 7));
  generateBufferBackedVariableAggregateTypeCases
            ((Context *)pSVar1,(SharedPtr *)parentStructure_00,&pTVar2->super_TestCaseGroup,
             PROGRAMINTERFACE_BUFFER_VARIABLE,PROGRAMRESOURCEPROP_OFFSET,TYPE_FLOAT,&local_58,3);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&unsized.m_state + 7));
  this = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this,(SharedPtr *)targetGroup_local,-2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&blockGroup_1,(Node *)this);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(Context *)parentStructure_local,"unsized","Unsized target");
  local_78 = pTVar2;
  tcu::TestNode::addChild(&blockGroup->super_TestNode,(TestNode *)pTVar2);
  pSVar1 = parentStructure_local;
  pTVar2 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  generateBufferBackedVariableAggregateTypeCases
            ((Context *)pSVar1,(SharedPtr *)&blockGroup_1,&pTVar2->super_TestCaseGroup,
             PROGRAMINTERFACE_BUFFER_VARIABLE,PROGRAMRESOURCEPROP_OFFSET,TYPE_FLOAT,&local_98,2);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&blockGroup_1);
  return;
}

Assistant:

static void generateBufferVariableOffsetCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup)
{
	// .sized
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_OFFSET, glu::TYPE_FLOAT, "", 3);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, unsized, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_OFFSET, glu::TYPE_FLOAT, "", 2);
	}
}